

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_5::DecFmtSymDataSink::put
          (DecFmtSymDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  DecimalFormatSymbols *this_00;
  ENumberFormatSymbol symbol;
  UBool UVar1;
  int iVar2;
  UnicodeString local_a0;
  ENumberFormatSymbol local_60;
  int32_t local_5c;
  int32_t i;
  int32_t j;
  ResourceTable symbolsTable;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  DecFmtSymDataSink *this_local;
  
  symbolsTable._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&i,value,errorCode);
  UVar1 = ::U_FAILURE(*(UErrorCode *)symbolsTable._32_8_);
  if (UVar1 == '\0') {
    local_5c = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)&i,local_5c,(char **)&value_local,value),
          UVar1 != '\0') {
      for (local_60 = kDecimalSeparatorSymbol; (int)local_60 < 0x1c;
          local_60 = local_60 + kGroupingSeparatorSymbol) {
        if ((*(long *)(gNumberElementKeys + (long)(int)local_60 * 8) != 0) &&
           (iVar2 = strcmp((char *)value_local,
                           *(char **)(gNumberElementKeys + (long)(int)local_60 * 8)),
           symbol = local_60, iVar2 == 0)) {
          if (this->seenSymbol[(int)local_60] == '\0') {
            this->seenSymbol[(int)local_60] = '\x01';
            this_00 = this->dfs;
            ResourceValue::getUnicodeString(&local_a0,value,(UErrorCode *)symbolsTable._32_8_);
            DecimalFormatSymbols::setSymbol(this_00,symbol,&local_a0,'\x01');
            UnicodeString::~UnicodeString(&local_a0);
            UVar1 = ::U_FAILURE(*(UErrorCode *)symbolsTable._32_8_);
            if (UVar1 != '\0') {
              return;
            }
          }
          break;
        }
      }
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable symbolsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t j = 0; symbolsTable.getKeyAndValue(j, key, value); ++j) {
            for (int32_t i=0; i<DecimalFormatSymbols::kFormatSymbolCount; i++) {
                if (gNumberElementKeys[i] != NULL && uprv_strcmp(key, gNumberElementKeys[i]) == 0) {
                    if (!seenSymbol[i]) {
                        seenSymbol[i] = TRUE;
                        dfs.setSymbol(
                            (DecimalFormatSymbols::ENumberFormatSymbol) i,
                            value.getUnicodeString(errorCode));
                        if (U_FAILURE(errorCode)) { return; }
                    }
                    break;
                }
            }
        }
    }